

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O3

bool lf::geometry::assertNonDegenerateQuad(Matrix<double,__1,_4,_0,__1,_4> *coords,double tol)

{
  PointerType pdVar1;
  PointerType pdVar2;
  Index rows;
  Index IVar3;
  Scalar SVar4;
  double dVar5;
  CoeffReturnType pdVar6;
  runtime_error *prVar7;
  PointerType pdVar8;
  long lVar9;
  long lVar10;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  *pCVar11;
  undefined8 *puVar12;
  byte bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  Matrix<double,_3,_4,_0,_3,_4> c3d;
  stringstream ss;
  undefined1 local_358 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  variable_if_dynamic<long,__1> local_338;
  variable_if_dynamic<long,__1> vStack_330;
  Index local_328;
  string local_320;
  undefined8 local_300;
  undefined8 uStack_2f8;
  Index local_2f0;
  undefined1 local_2e8 [8];
  undefined8 uStack_2e0;
  undefined1 local_2d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2c8;
  variable_if_dynamic<long,__1> local_2b8;
  variable_if_dynamic<long,__1> vStack_2b0;
  double local_2a8;
  PointerType local_2a0;
  variable_if_dynamic<long,__1> local_298;
  double dStack_290;
  XprTypeNested local_288;
  variable_if_dynamic<long,__1> vStack_280;
  undefined1 local_258 [12];
  undefined4 uStack_24c;
  undefined1 local_248 [12];
  undefined4 uStack_23c;
  double local_238;
  double dStack_230;
  double local_220;
  string local_218;
  double local_1f8;
  undefined8 uStack_1f0;
  double local_1e8;
  undefined8 uStack_1e0;
  double local_1d8;
  undefined8 uStack_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [16];
  XprTypeNested local_1a8;
  long local_170;
  
  stack0xfffffffffffffdb0 = (double)local_258._0_8_;
  bVar13 = 0;
  stack0xfffffffffffffdc0 = (double)local_248._0_8_;
  local_248._0_8_ = tol;
  rows = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_rows;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
  MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
          local_358,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_data
          + rows,rows,1);
  local_338.m_value = 0;
  vStack_330.m_value = 1;
  local_328 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.
              m_rows;
  local_348._8_8_ = coords;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
  MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
          &local_320,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_data,
          local_328,1);
  local_300 = 0;
  uStack_2f8 = 0;
  local_2f0 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.
              m_rows;
  local_320.field_2._8_8_ = coords;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                   *)local_2d8,(Lhs *)local_358,(Rhs *)&local_320,
                  (scalar_difference_op<double,_double> *)local_1b8);
  pCVar11 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
             *)local_2d8;
  puVar12 = (undefined8 *)(local_1b8 + 8);
  for (lVar9 = 0xe; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar12 = (pCVar11->m_lhs).
               super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>
               .m_data;
    pCVar11 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
               *)((long)pCVar11 + (ulong)bVar13 * -0x10 + 8);
    puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
  }
  local_258._0_4_ = 0;
  local_258._4_4_ = 0;
  local_2e8 = (undefined1  [8])0x0;
  if (local_170 != 0) {
    SVar4 = Eigen::
            DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const>const>>
            ::redux<Eigen::internal::scalar_sum_op<double,double>>
                      ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>const>>
                        *)local_1b8,(scalar_sum_op<double,_double> *)&local_218);
    local_258._0_4_ = SUB84(SVar4,0);
    local_258._4_4_ = (undefined4)((ulong)SVar4 >> 0x20);
  }
  IVar3 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_rows;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
  MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
          local_358,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_data
          + IVar3 * 2,IVar3,1);
  local_338.m_value = 0;
  vStack_330.m_value = 2;
  local_328 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.
              m_rows;
  local_348._8_8_ = coords;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
  MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
          &local_320,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_data
          + local_328,local_328,1);
  local_300 = 0;
  uStack_2f8 = 1;
  local_2f0 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.
              m_rows;
  local_320.field_2._8_8_ = coords;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                   *)local_2d8,(Lhs *)local_358,(Rhs *)&local_320,
                  (scalar_difference_op<double,_double> *)local_1b8);
  pCVar11 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
             *)local_2d8;
  puVar12 = (undefined8 *)(local_1b8 + 8);
  for (lVar9 = 0xe; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar12 = (pCVar11->m_lhs).
               super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>
               .m_data;
    pCVar11 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
               *)((long)pCVar11 + (ulong)bVar13 * -0x10 + 8);
    puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
  }
  if (local_170 != 0) {
    local_2e8 = (undefined1  [8])
                Eigen::
                DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const>const>>
                ::redux<Eigen::internal::scalar_sum_op<double,double>>
                          ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>const>>
                            *)local_1b8,(scalar_sum_op<double,_double> *)&local_218);
  }
  IVar3 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_rows;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
  MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
          local_358,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_data
          + IVar3 * 3,IVar3,1);
  local_338.m_value = 0;
  vStack_330.m_value = 3;
  local_328 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.
              m_rows;
  local_348._8_8_ = coords;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
  MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
          &local_320,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_data
          + local_328 * 2,local_328,1);
  local_300 = 0;
  uStack_2f8 = 2;
  local_2f0 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.
              m_rows;
  local_320.field_2._8_8_ = coords;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                   *)local_2d8,(Lhs *)local_358,(Rhs *)&local_320,
                  (scalar_difference_op<double,_double> *)local_1b8);
  pCVar11 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
             *)local_2d8;
  puVar12 = (undefined8 *)(local_1b8 + 8);
  for (lVar9 = 0xe; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar12 = (pCVar11->m_lhs).
               super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>
               .m_data;
    pCVar11 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
               *)((long)pCVar11 + (ulong)bVar13 * -0x10 + 8);
    puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
  }
  uVar14 = 0;
  uVar15 = 0;
  if (local_170 != 0) {
    SVar4 = Eigen::
            DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const>const>>
            ::redux<Eigen::internal::scalar_sum_op<double,double>>
                      ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>const>>
                        *)local_1b8,(scalar_sum_op<double,_double> *)&local_218);
    uVar14 = SUB84(SVar4,0);
    uVar15 = (undefined4)((ulong)SVar4 >> 0x20);
  }
  local_238 = (double)CONCAT44(uVar15,uVar14);
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
  MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
          local_358,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_data,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_rows,
          1);
  local_338.m_value = 0;
  vStack_330.m_value = 0;
  local_328 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.
              m_rows;
  local_348._8_8_ = coords;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
  MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
          &local_320,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_data
          + local_328 * 3,local_328,1);
  local_300 = 0;
  uStack_2f8 = 3;
  local_2f0 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.
              m_rows;
  local_320.field_2._8_8_ = coords;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                   *)local_2d8,(Lhs *)local_358,(Rhs *)&local_320,
                  (scalar_difference_op<double,_double> *)local_1b8);
  pCVar11 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
             *)local_2d8;
  puVar12 = (undefined8 *)(local_1b8 + 8);
  for (lVar9 = 0xe; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar12 = (pCVar11->m_lhs).
               super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>
               .m_data;
    pCVar11 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
               *)((long)pCVar11 + (ulong)bVar13 * -0x10 + 8);
    puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
  }
  uVar14 = 0;
  uVar15 = 0;
  if (local_170 != 0) {
    SVar4 = Eigen::
            DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const>const>>
            ::redux<Eigen::internal::scalar_sum_op<double,double>>
                      ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>const>>
                        *)local_1b8,(scalar_sum_op<double,_double> *)&local_218);
    uVar14 = SUB84(SVar4,0);
    uVar15 = (undefined4)((ulong)SVar4 >> 0x20);
  }
  local_220 = ((double)local_258._0_8_ + (double)local_2e8 + local_238 +
              (double)CONCAT44(uVar15,uVar14)) * (double)local_248._0_8_;
  if ((double)local_258._0_8_ <= local_220) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Collapsed edge 0",0x10);
    local_2d8._0_8_ = local_2d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"e0lensq > tol * circum","")
    ;
    local_358._0_8_ = local_358 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_2d8,(string *)local_358,0x17,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_,local_348._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
      operator_delete((void *)local_2d8._0_8_,aStack_2c8._M_allocated_capacity + 1);
    }
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"this code should not be reached");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((double)local_2e8 <= local_220) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Collapsed edge 1",0x10);
    local_2d8._0_8_ = local_2d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"e1lensq > tol * circum","")
    ;
    local_358._0_8_ = local_358 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_2d8,(string *)local_358,0x18,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_,local_348._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
      operator_delete((void *)local_2d8._0_8_,aStack_2c8._M_allocated_capacity + 1);
    }
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"this code should not be reached");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_220 < local_238) {
    if ((double)CONCAT44(uVar15,uVar14) < local_220 || (double)CONCAT44(uVar15,uVar14) == local_220)
    {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Collapsed edge 3",0x10);
      local_2d8._0_8_ = local_2d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d8,"e3lensq > tol * circum","");
      local_358._0_8_ = local_358 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_2d8,(string *)local_358,0x1a,&local_320);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
        operator_delete((void *)local_358._0_8_,local_348._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
        operator_delete((void *)local_2d8._0_8_,aStack_2c8._M_allocated_capacity + 1);
      }
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"this code should not be reached");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((int)rows == 3) {
      Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_3,_4,_false>::Block
                ((Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,_3,_4,_false> *)local_1b8,
                 coords,0,0);
      lVar9 = (local_1a8->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.
              m_rows;
      pdVar8 = (PointerType)(local_1b8._0_8_ + 0x10);
      lVar10 = 0x10;
      do {
        dVar5 = pdVar8[-1];
        *(double *)(local_2e8 + lVar10) = pdVar8[-2];
        *(double *)(local_2e8 + lVar10 + 8) = dVar5;
        *(double *)(local_2d8 + lVar10) = *pdVar8;
        lVar10 = lVar10 + 0x18;
        pdVar8 = pdVar8 + lVar9;
      } while (lVar10 != 0x70);
      dVar5 = (double)local_2a0 - (double)local_2d8._8_8_;
      dVar17 = (double)local_298.m_value - (double)aStack_2c8._M_allocated_capacity;
      local_2a8 = local_2a8 - (double)local_2d8._0_8_;
      dVar19 = ((double)local_2b8.m_value - (double)local_2d8._8_8_) * dVar17 -
               ((double)vStack_2b0.m_value - (double)aStack_2c8._M_allocated_capacity) * dVar5;
      dVar20 = ((double)vStack_2b0.m_value - (double)aStack_2c8._M_allocated_capacity) * local_2a8 -
               ((double)aStack_2c8._8_8_ - (double)local_2d8._0_8_) * dVar17;
      dVar16 = ((double)aStack_2c8._8_8_ - (double)local_2d8._0_8_) * dVar5 -
               ((double)local_2b8.m_value - (double)local_2d8._8_8_) * local_2a8;
      dVar18 = dVar17 * ((double)local_288 - (double)local_2d8._8_8_) -
               ((double)vStack_280.m_value - (double)aStack_2c8._M_allocated_capacity) * dVar5;
      dVar17 = local_2a8 * ((double)vStack_280.m_value - (double)aStack_2c8._M_allocated_capacity) -
               (dStack_290 - (double)local_2d8._0_8_) * dVar17;
      dVar5 = dVar5 * (dStack_290 - (double)local_2d8._0_8_) -
              ((double)local_288 - (double)local_2d8._8_8_) * local_2a8;
      if (SQRT(dVar16 * dVar16 + dVar20 * dVar20 + dVar19 * dVar19) +
          SQRT(dVar5 * dVar5 + dVar17 * dVar17 + dVar18 * dVar18) <= local_220) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Degenerate 3D quad",0x12);
        local_358._0_8_ = local_358 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_358,"area > tol * circum","");
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_320,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_358,&local_320,0x30,&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
          operator_delete((void *)local_358._0_8_,local_348._M_allocated_capacity + 1);
        }
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"this code should not be reached");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      if ((int)rows != 2) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Illegal world dimension",0x17);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        pdVar2 = (PointerType)(local_2d8 + 0x10);
        local_2d8._0_8_ = pdVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"false","");
        pdVar1 = (PointerType)(local_358 + 0x10);
        local_358._0_8_ = pdVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_358,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_2d8,(string *)local_358,0x35,&local_320);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((PointerType)local_358._0_8_ != pdVar1) {
          operator_delete((void *)local_358._0_8_,local_348._M_allocated_capacity + 1);
        }
        if ((PointerType)local_2d8._0_8_ != pdVar2) {
          operator_delete((void *)local_2d8._0_8_,aStack_2c8._M_allocated_capacity + 1);
        }
        local_2d8._0_8_ = pdVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"false","");
        local_358._0_8_ = pdVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_358,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                   ,"");
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"");
        base::AssertionFailed((string *)local_2d8,(string *)local_358,0x35,&local_320);
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::~string((string *)local_358);
        std::__cxx11::string::~string((string *)local_2d8);
        abort();
      }
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,0,1);
      stack0xfffffffffffffdc0 = 0.0;
      local_248._0_8_ = *pdVar6;
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,0,0);
      local_1f8 = *pdVar6;
      uStack_1f0 = 0;
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,1,2);
      stack0xfffffffffffffdb0 = 0.0;
      local_258._0_8_ = *pdVar6;
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,1,0);
      local_1e8 = *pdVar6;
      uStack_1e0 = 0;
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,1,1);
      uStack_2e0 = 0.0;
      local_2e8 = (undefined1  [8])*pdVar6;
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,1,0);
      local_1d8 = *pdVar6;
      uStack_1d0 = 0;
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,0,2);
      local_238 = *pdVar6;
      dStack_230 = 0.0;
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,0,0);
      local_1c8 = *pdVar6;
      uStack_1c0 = 0;
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,0,3);
      local_248._8_4_ = SUB84(*pdVar6,0);
      uStack_23c = (int)((ulong)*pdVar6 >> 0x20);
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,0,0);
      dVar5 = stack0xfffffffffffffdc0 - *pdVar6;
      local_248._8_4_ = SUB84(dVar5,0);
      local_248._0_8_ = (double)local_248._0_8_ - local_1f8;
      uStack_23c = (int)((ulong)dVar5 >> 0x20);
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,1,2);
      local_258._8_4_ = SUB84(*pdVar6,0);
      uStack_24c = (int)((ulong)*pdVar6 >> 0x20);
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,1,0);
      dVar5 = (stack0xfffffffffffffdb0 - *pdVar6) * stack0xfffffffffffffdc0;
      local_258._8_4_ = SUB84(dVar5,0);
      local_258._0_8_ = ((double)local_258._0_8_ - local_1e8) * (double)local_248._0_8_;
      uStack_24c = (int)((ulong)dVar5 >> 0x20);
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,1,3);
      uStack_2e0._0_4_ = SUB84(*pdVar6,0);
      uStack_2e0._4_4_ = (int)((ulong)*pdVar6 >> 0x20);
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,1,0);
      dVar5 = uStack_2e0 - *pdVar6;
      uStack_2e0._0_4_ = SUB84(dVar5,0);
      local_2e8 = (undefined1  [8])((double)local_2e8 - local_1d8);
      uStack_2e0._4_4_ = (int)((ulong)dVar5 >> 0x20);
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,0,2);
      dStack_230 = *pdVar6;
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>,_0> *)coords,0,0);
      if (ABS(stack0xfffffffffffffdb0 - (dStack_230 - *pdVar6) * uStack_2e0) +
          ABS((double)local_258._0_8_ - (local_238 - local_1c8) * (double)local_2e8) <= local_220) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Degenerate 2D quad",0x12);
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2d8,"area > tol * circum","");
        local_358._0_8_ = local_358 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_358,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_2d8,(string *)local_358,0x25,&local_320);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
          operator_delete((void *)local_358._0_8_,local_348._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
          operator_delete((void *)local_2d8._0_8_,aStack_2c8._M_allocated_capacity + 1);
        }
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"this code should not be reached");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    return true;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Collapsed edge 2",0x10);
  local_2d8._0_8_ = local_2d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"e2lensq > tol * circum","");
  local_358._0_8_ = local_358 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed((string *)local_2d8,(string *)local_358,0x19,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
    operator_delete((void *)local_358._0_8_,local_348._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
    operator_delete((void *)local_2d8._0_8_,aStack_2c8._M_allocated_capacity + 1);
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"this code should not be reached");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool assertNonDegenerateQuad(
    const Eigen::Matrix<double, Eigen::Dynamic, 4>& coords, double tol) {
  // World dimension
  const Geometry::dim_t wd = coords.rows();
  // Length tests
  const double e0lensq = (coords.col(1) - coords.col(0)).squaredNorm();
  const double e1lensq = (coords.col(2) - coords.col(1)).squaredNorm();
  const double e2lensq = (coords.col(3) - coords.col(2)).squaredNorm();
  const double e3lensq = (coords.col(0) - coords.col(3)).squaredNorm();
  // Test lengths of edges versus circumference.
  const double circum = e0lensq + e1lensq + e2lensq + e3lensq;
  LF_VERIFY_MSG(e0lensq > tol * circum, "Collapsed edge 0");
  LF_VERIFY_MSG(e1lensq > tol * circum, "Collapsed edge 1");
  LF_VERIFY_MSG(e2lensq > tol * circum, "Collapsed edge 2");
  LF_VERIFY_MSG(e3lensq > tol * circum, "Collapsed edge 3");
  // Area test
  switch (wd) {
    case 2: {
      const double ar1 =
          ((coords(0, 1) - coords(0, 0)) * (coords(1, 2) - coords(1, 0)) -
           (coords(1, 1) - coords(1, 0)) * (coords(0, 2) - coords(0, 0)));
      const double ar2 =
          ((coords(0, 3) - coords(0, 0)) * (coords(1, 2) - coords(1, 0)) -
           (coords(1, 3) - coords(1, 0)) * (coords(0, 2) - coords(0, 0)));
      const double area = std::fabs(ar1) + std::fabs(ar2);
      LF_VERIFY_MSG(area > tol * circum, "Degenerate 2D quad");
      return true;
      break;
    }
    case 3: {
      const Eigen::Matrix<double, 3, 4> c3d(coords.block<3, 4>(0, 0));
      const double ar1 =
          ((c3d.col(1) - c3d.col(0)).cross(c3d.col(2) - c3d.col(0))).norm();
      const double ar2 =
          ((c3d.col(3) - c3d.col(0)).cross(c3d.col(2) - c3d.col(0))).norm();
      const double area = ar1 + ar2;
      LF_VERIFY_MSG(area > tol * circum, "Degenerate 3D quad");
      return true;
      break;
    }
    default: {
      LF_ASSERT_MSG(false, "Illegal world dimension" << wd);
      break;
    }
  }
  return false;
}